

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O0

SpatialForceVector * iDynTree::getRandomWrench(void)

{
  VectorFixSize<3U> *this;
  double *pdVar1;
  SpatialForceVector *in_RDI;
  double dVar2;
  int i;
  SpatialForceVector *ret;
  SpatialForceVector *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  VectorFixSize<3U> *in_stack_ffffffffffffffb0;
  int local_10;
  
  SpatialForceVector::SpatialForceVector(in_stack_ffffffffffffffa0);
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    dVar2 = getRandomDouble((double)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    this = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>)->super_Vector3;
    pdVar1 = VectorFixSize<3U>::operator()(this,(long)local_10);
    *pdVar1 = dVar2;
    in_stack_ffffffffffffffa8 =
         getRandomDouble((double)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0 =
         &SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                    (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>)->super_Vector3;
    pdVar1 = VectorFixSize<3U>::operator()(in_stack_ffffffffffffffb0,(long)local_10);
    *pdVar1 = in_stack_ffffffffffffffa8;
  }
  return in_RDI;
}

Assistant:

SpatialForceVector getRandomWrench()
{
    SpatialForceVector ret;

    for(int i=0; i < 3; i++ )
    {
        ret.getLinearVec3()(i) = getRandomDouble();
        ret.getAngularVec3()(i) = getRandomDouble();
    }

    return ret;
}